

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 float32_sub_m68k(float32 a,float32 b,float_status *s)

{
  float32 fVar1;
  byte bVar2;
  union_float32 ub;
  ulong uVar3;
  union_float32 ua;
  ulong uVar4;
  float fVar5;
  
  uVar4 = (ulong)a;
  uVar3 = (ulong)b;
  bVar2 = s->float_exception_flags;
  if (((bVar2 & 0x20) == 0) || (s->float_rounding_mode != '\0')) goto LAB_006bf95d;
  if (s->flush_inputs_to_zero != '\0') {
    if ((a & 0x7fffffff) == 0 || (a & 0x7f800000) != 0) {
      if ((b & 0x7fffffff) == 0 || (b & 0x7f800000) != 0) goto LAB_006bf89f;
LAB_006bf93f:
      uVar3 = (ulong)(b & 0x80000000);
      bVar2 = bVar2 | 0x40;
    }
    else {
      uVar4 = (ulong)(a & 0x80000000);
      bVar2 = bVar2 | 0x40;
      if ((b & 0x7f800000) == 0 && (b & 0x7fffffff) != 0) goto LAB_006bf93f;
    }
    s->float_exception_flags = bVar2;
  }
LAB_006bf89f:
  b = (float32)uVar3;
  a = (float32)uVar4;
  if ((((uVar4 & 0x7fffffff) == 0) || (((int)(uVar4 >> 0x17) + 1U & 0xfe) != 0)) &&
     (((uVar3 & 0x7fffffff) == 0 || (((int)(uVar3 >> 0x17) + 1U & 0xfe) != 0)))) {
    fVar5 = (float)a - (float)b;
    if (ABS(fVar5) == INFINITY) {
      s->float_exception_flags = bVar2 | 8;
      return (float32)fVar5;
    }
    if ((1.1754944e-38 < ABS(fVar5)) || (((b | a) & 0x7fffffff) == 0)) {
      return (float32)fVar5;
    }
  }
LAB_006bf95d:
  fVar1 = soft_f32_addsub(a,b,true,s);
  return fVar1;
}

Assistant:

float32 QEMU_FLATTEN
float32_sub(float32 a, float32 b, float_status *s)
{
    return float32_addsub(a, b, s, hard_f32_sub, soft_f32_sub);
}